

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategyDriver.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  GameLoop *pGVar3;
  vector<Player_*,_std::allocator<Player_*>_> *pvVar4;
  reference ppPVar5;
  ostream *poVar6;
  PlayerStrategy *pPVar7;
  string local_a0;
  Player *local_80;
  Player *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Player_*,_std::allocator<Player_*>_> *__range2_1;
  string local_50;
  Player *local_30;
  Player *p;
  iterator __end2;
  iterator __begin2;
  vector<Player_*,_std::allocator<Player_*>_> *__range2;
  char choice;
  
  __range2._4_4_ = 0;
  __range2._3_1_ = '\0';
  GameLoop::startSingle(true);
  pGVar3 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar3);
  std::operator<<((ostream *)&std::cout,
                  "All players have been initialized. Do you want to make all players Humans?(y/n)")
  ;
  std::operator>>((istream *)&std::cin,(char *)((long)&__range2 + 3));
  if (__range2._3_1_ == 'y') {
    pGVar3 = GameLoop::getInstance();
    pvVar4 = GameLoop::getAllPlayers(pGVar3);
    __end2 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(pvVar4);
    p = (Player *)std::vector<Player_*,_std::allocator<Player_*>_>::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                                       *)&p), bVar1) {
      ppPVar5 = __gnu_cxx::
                __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
                operator*(&__end2);
      local_30 = *ppPVar5;
      poVar6 = std::operator<<((ostream *)&std::cout,"Player ");
      iVar2 = Player::getPlayerId(local_30);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      poVar6 = std::operator<<(poVar6," was ");
      pPVar7 = Player::getStrategy(local_30);
      PlayerStrategy::getStrategyName_abi_cxx11_(&local_50,pPVar7);
      poVar6 = std::operator<<(poVar6,(string *)&local_50);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_50);
      Player::setPlayerStrategy(local_30,HUMAN_PLAYER);
      __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
      operator++(&__end2);
    }
  }
  else {
    pGVar3 = GameLoop::getInstance();
    pvVar4 = GameLoop::getAllPlayers(pGVar3);
    __end2_1 = std::vector<Player_*,_std::allocator<Player_*>_>::begin(pvVar4);
    p_1 = (Player *)std::vector<Player_*,_std::allocator<Player_*>_>::end(pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>
                               *)&p_1), bVar1) {
      ppPVar5 = __gnu_cxx::
                __normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
                operator*(&__end2_1);
      local_80 = *ppPVar5;
      poVar6 = std::operator<<((ostream *)&std::cout,"Player ");
      iVar2 = Player::getPlayerId(local_80);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      poVar6 = std::operator<<(poVar6," is ");
      pPVar7 = Player::getStrategy(local_80);
      PlayerStrategy::getStrategyName_abi_cxx11_(&local_a0,pPVar7);
      poVar6 = std::operator<<(poVar6,(string *)&local_a0);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_a0);
      __gnu_cxx::__normal_iterator<Player_**,_std::vector<Player_*,_std::allocator<Player_*>_>_>::
      operator++(&__end2_1);
    }
  }
  pGVar3 = GameLoop::getInstance();
  GameLoop::loop(pGVar3,-1);
  GameLoop::resetInstance();
  return 0;
}

Assistant:

int main() {

    char choice = '\0';
    GameLoop::startSingle(true);
    GameLoop::getInstance()->distributeArmies();


    std::cout << "All players have been initialized. Do you want to make all players Humans?(y/n)";
    std::cin >> choice;
    if(choice == 'y') {
        for(auto* p : *GameLoop::getInstance()->getAllPlayers()) {
            std::cout << "Player " << p->getPlayerId() << " was " << p->getStrategy()->getStrategyName() << std::endl;
            p->setPlayerStrategy(Strategies::HUMAN_PLAYER);
        }
    } else {
        for(auto* p : *GameLoop::getInstance()->getAllPlayers()) {
            std::cout << "Player " << p->getPlayerId() << " is " << p->getStrategy()->getStrategyName() << std::endl;
        }
    }

    GameLoop::getInstance()->loop();

    GameLoop::resetInstance();
    return 0;
}